

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O1

int gzvprintf(gzFile file,char *format,__va_list_tag *va)

{
  uint uVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  char *__s;
  uint uVar5;
  
  if (file == (gzFile)0x0) {
    return -2;
  }
  if (file[1].have != 0x79b1) {
    return -2;
  }
  if (*(int *)((long)&file[4].next + 4) != 0) {
    return -2;
  }
  if (((int)file[1].pos != 0) || (iVar3 = gz_init((gz_statep)file), iVar3 != -1)) {
    if (*(int *)&file[4].next != 0) {
      *(undefined4 *)&file[4].next = 0;
      iVar3 = gz_zero((gz_statep)file,*(off64_t *)(file + 4));
      if (iVar3 == -1) goto LAB_00107350;
    }
    if ((ulong)*(uint *)&file[5].next == 0) {
      uVar2 = *(undefined4 *)&file[2].field_0x4;
      file[5].have = file[2].have;
      *(undefined4 *)&file[5].field_0x4 = uVar2;
    }
    __s = (char *)((ulong)*(uint *)&file[5].next + *(long *)(file + 5));
    __s[(int)file[1].pos - 1] = '\0';
    uVar4 = vsnprintf(__s,(ulong)(uint)file[1].pos,format,va);
    if (uVar4 == 0) {
      return 0;
    }
    uVar1 = (uint)file[1].pos;
    if (uVar1 <= uVar4) {
      return 0;
    }
    if (__s[uVar1 - 1] != '\0') {
      return 0;
    }
    uVar5 = *(int *)&file[5].next + uVar4;
    *(uint *)&file[5].next = uVar5;
    file->pos = file->pos + (long)(int)uVar4;
    if (uVar5 < uVar1) {
      return uVar4;
    }
    *(uint *)&file[5].next = uVar1;
    iVar3 = gz_comp((gz_statep)file,0);
    if (iVar3 != -1) {
      memcpy(*(void **)(file + 2),(void *)((ulong)(uint)file[1].pos + (long)*(void **)(file + 2)),
             (ulong)(uVar5 - uVar1));
      uVar2 = *(undefined4 *)&file[2].field_0x4;
      file[5].have = file[2].have;
      *(undefined4 *)&file[5].field_0x4 = uVar2;
      *(uint *)&file[5].next = uVar5 - uVar1;
      return uVar4;
    }
  }
LAB_00107350:
  return *(int *)((long)&file[4].next + 4);
}

Assistant:

int ZEXPORTVA gzvprintf(gzFile file, const char *format, va_list va)
{
    int len;
    unsigned left;
    char *next;
    gz_statep state;
    z_streamp strm;

    /* get internal structure */
    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_statep)file;
    strm = &(state->strm);

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return Z_STREAM_ERROR;

    /* make sure we have some buffer space */
    if (state->size == 0 && gz_init(state) == -1)
        return state->err;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return state->err;
    }

    /* do the printf() into the input buffer, put length in len -- the input
       buffer is double-sized just for this function, so there is guaranteed to
       be state->size bytes available after the current contents */
    if (strm->avail_in == 0)
        strm->next_in = state->in;
    next = (char *)(state->in + (strm->next_in - state->in) + strm->avail_in);
    next[state->size - 1] = 0;
#ifdef NO_vsnprintf
#  ifdef HAS_vsprintf_void
    (void)vsprintf(next, format, va);
    for (len = 0; len < state->size; len++)
        if (next[len] == 0) break;
#  else
    len = vsprintf(next, format, va);
#  endif
#else
#  ifdef HAS_vsnprintf_void
    (void)vsnprintf(next, state->size, format, va);
    len = strlen(next);
#  else
    len = vsnprintf(next, state->size, format, va);
#  endif
#endif

    /* check that printf() results fit in buffer */
    if (len == 0 || (unsigned)len >= state->size || next[state->size - 1] != 0)
        return 0;

    /* update buffer and position, compress first half if past that */
    strm->avail_in += (unsigned)len;
    state->x.pos += len;
    if (strm->avail_in >= state->size) {
        left = strm->avail_in - state->size;
        strm->avail_in = state->size;
        if (gz_comp(state, Z_NO_FLUSH) == -1)
            return state->err;
        memcpy(state->in, state->in + state->size, left);
        strm->next_in = state->in;
        strm->avail_in = left;
    }
    return len;
}